

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

string * __thiscall
soul::CompileMessage::getSeverity_abi_cxx11_(string *__return_storage_ptr__,CompileMessage *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((this->type & ~internalCompilerError) == error) {
    __s = "error";
    __a = &local_9;
  }
  else {
    if (this->type != warning) {
      throwInternalCompilerError("getSeverity",0x53);
    }
    __s = "warning";
    __a = &local_a;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getSeverity() const
{
    if (isError())    return "error";
    if (isWarning())  return "warning";

    SOUL_ASSERT_FALSE;
    return {};
}